

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omplexer.cc
# Opt level: O1

void openmp_push_buffer_state(YY_BUFFER_STATE new_buffer)

{
  YY_BUFFER_STATE *ppyVar1;
  size_t sVar2;
  
  if (new_buffer != (YY_BUFFER_STATE)0x0) {
    openmp_ensure_buffer_stack();
    sVar2 = yy_buffer_stack_top;
    ppyVar1 = yy_buffer_stack;
    if (yy_buffer_stack != (YY_BUFFER_STATE *)0x0) {
      if (yy_buffer_stack[yy_buffer_stack_top] != (YY_BUFFER_STATE)0x0) {
        *yy_c_buf_p = yy_hold_char;
        ppyVar1[sVar2]->yy_buf_pos = yy_c_buf_p;
        ppyVar1[sVar2]->yy_n_chars = yy_n_chars;
      }
      if ((ppyVar1 != (YY_BUFFER_STATE *)0x0) &&
         (ppyVar1[yy_buffer_stack_top] != (YY_BUFFER_STATE)0x0)) {
        yy_buffer_stack_top = yy_buffer_stack_top + 1;
      }
    }
    sVar2 = yy_buffer_stack_top;
    ppyVar1[yy_buffer_stack_top] = new_buffer;
    yy_n_chars = new_buffer->yy_n_chars;
    openmp_text = new_buffer->yy_buf_pos;
    openmp_in = ppyVar1[sVar2]->yy_input_file;
    yy_hold_char = *openmp_text;
    yy_c_buf_p = openmp_text;
  }
  return;
}

Assistant:

void yypush_buffer_state (YY_BUFFER_STATE new_buffer )
{
    	if (new_buffer == NULL)
		return;

	yyensure_buffer_stack();

	/* This block is copied from yy_switch_to_buffer. */
	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*(yy_c_buf_p) = (yy_hold_char);
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = (yy_c_buf_p);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	/* Only push if top exists. Otherwise, replace top. */
	if (YY_CURRENT_BUFFER)
		(yy_buffer_stack_top)++;
	YY_CURRENT_BUFFER_LVALUE = new_buffer;

	/* copied from yy_switch_to_buffer. */
	yy_load_buffer_state(  );
	(yy_did_buffer_switch_on_eof) = 1;
}